

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_return::~statement_return(statement_return *this)

{
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x1e85bc);
  statement_base::~statement_base((statement_base *)0x1e85c6);
  return;
}

Assistant:

statement_return() = delete;